

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_trap(m68k_info *info,int size,int immediate)

{
  int in_ESI;
  undefined8 in_RDI;
  m68k_info *unaff_retaddr;
  
  build_absolute_jump_with_immediate(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI);
  return;
}

Assistant:

static void build_trap(m68k_info *info, int size, int immediate)
{
	build_absolute_jump_with_immediate(info, s_trap_lut[(info->ir >> 8) & 0xf], size, immediate);
}